

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordTopocentric.h
# Opt level: O1

string * __thiscall
CoordTopocentric::ToString_abi_cxx11_(string *__return_storage_ptr__,CoordTopocentric *this)

{
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xffffff4f | 0x80;
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"Az: ",4);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18) + 8) = 8;
  std::ostream::_M_insert<double>((this->azimuth * 180.0) / 3.141592653589793);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,", El: ",6);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18) + 8) = 8;
  std::ostream::_M_insert<double>((this->elevation * 180.0) / 3.141592653589793);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,", Rng: ",7);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18) + 8) = 10;
  std::ostream::_M_insert<double>(this->range);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,", Rng Rt: ",10);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18) + 8) = 7;
  std::ostream::_M_insert<double>(this->range_rate);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;
        ss << std::right << std::fixed << std::setprecision(3);
        ss << "Az: " << std::setw(8) << Util::RadiansToDegrees(azimuth);
        ss << ", El: " << std::setw(8) << Util::RadiansToDegrees(elevation);
        ss << ", Rng: " << std::setw(10) << range;
        ss << ", Rng Rt: " << std::setw(7) << range_rate;
        return ss.str();
    }